

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNewLineStyle.cxx
# Opt level: O1

bool __thiscall
cmNewLineStyle::ReadFromArguments
          (cmNewLineStyle *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,string *errorString)

{
  int iVar1;
  ulong uVar2;
  pointer pbVar3;
  byte bVar4;
  long unaff_R14;
  bool bVar5;
  
  this->NewLineStyle = Invalid;
  pbVar3 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  bVar5 = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish == pbVar3;
  if (bVar5) {
LAB_001962cf:
    bVar4 = (byte)unaff_R14;
    goto LAB_00196305;
  }
  iVar1 = std::__cxx11::string::compare((char *)pbVar3);
  uVar2 = 1;
  if (iVar1 != 0) {
    unaff_R14 = 0x20;
    do {
      pbVar3 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      bVar5 = (ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5) <=
              uVar2;
      if (bVar5) goto LAB_001962cf;
      iVar1 = std::__cxx11::string::compare((char *)((long)&(pbVar3->_M_dataplus)._M_p + unaff_R14))
      ;
      uVar2 = uVar2 + 1;
      unaff_R14 = unaff_R14 + 0x20;
    } while (iVar1 != 0);
  }
  pbVar3 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5) <= uVar2) {
    bVar4 = 0;
    std::__cxx11::string::_M_replace
              ((ulong)errorString,0,(char *)errorString->_M_string_length,0x51b604);
    goto LAB_00196305;
  }
  pbVar3 = pbVar3 + uVar2;
  iVar1 = std::__cxx11::string::compare((char *)pbVar3);
  if (iVar1 == 0) {
LAB_001962f2:
    this->NewLineStyle = LF;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)pbVar3);
    if (iVar1 == 0) goto LAB_001962f2;
    iVar1 = std::__cxx11::string::compare((char *)pbVar3);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)pbVar3);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)pbVar3);
        if (iVar1 != 0) {
          std::__cxx11::string::operator=
                    ((string *)errorString,
                     "NEWLINE_STYLE sets an unknown style, only LF, CRLF, UNIX, DOS, and WIN32 are supported"
                    );
          bVar4 = 0;
          goto LAB_00196305;
        }
      }
    }
    this->NewLineStyle = CRLF;
  }
  bVar4 = 1;
LAB_00196305:
  return (bool)(bVar5 | bVar4 & 1);
}

Assistant:

bool cmNewLineStyle::ReadFromArguments(const std::vector<std::string>& args,
                                       std::string& errorString)
{
  NewLineStyle = Invalid;

  for (size_t i = 0; i < args.size(); i++) {
    if (args[i] == "NEWLINE_STYLE") {
      size_t const styleIndex = i + 1;
      if (args.size() > styleIndex) {
        std::string const& eol = args[styleIndex];
        if (eol == "LF" || eol == "UNIX") {
          NewLineStyle = LF;
          return true;
        }
        if (eol == "CRLF" || eol == "WIN32" || eol == "DOS") {
          NewLineStyle = CRLF;
          return true;
        }
        errorString = "NEWLINE_STYLE sets an unknown style, only LF, "
                      "CRLF, UNIX, DOS, and WIN32 are supported";
        return false;
      }
      errorString = "NEWLINE_STYLE must set a style: "
                    "LF, CRLF, UNIX, DOS, or WIN32";
      return false;
    }
  }
  return true;
}